

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O3

void tcmalloc::Log(LogMode mode,char *filename,int line,LogItem a,LogItem b,LogItem c,LogItem d)

{
  char **msg;
  code *pcVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  char *__src;
  undefined1 auVar6 [8];
  undefined1 local_140 [8];
  Logger state;
  char space [22];
  undefined1 local_48 [8];
  LogItem a_local;
  
  a_local._0_8_ = a.u_;
  local_48._0_4_ = a.tag_;
  msg = &state.end_;
  pcVar2 = state.buf_ + 0xc0;
  local_140 = (undefined1  [8])msg;
  state.p_ = pcVar2;
  a_local.u_.unum._4_4_ = mode;
  sVar4 = strlen(filename);
  sVar4 = (size_t)(int)sVar4;
  auVar6 = local_140;
  if ((long)sVar4 < 0xc9) {
    memcpy(msg,filename,sVar4);
    auVar6 = (undefined1  [8])(sVar4 + (long)msg);
    if ((undefined1  [8])pcVar2 != auVar6 && -1 < (long)pcVar2 - (long)auVar6) {
      *(undefined1 *)auVar6 = 0x3a;
      local_140 = (undefined1  [8])(state.buf_ + (sVar4 - 7));
      sVar4 = 0;
      uVar5 = (long)line;
      pcVar2 = space + 0xd;
      do {
        __src = pcVar2;
        *__src = "0123456789abcdef"[uVar5 % 10];
        sVar4 = sVar4 + 1;
        if (uVar5 < 10) break;
        uVar5 = uVar5 / 10;
        pcVar2 = __src + -1;
      } while (state.buf_ + 0xc0 < __src);
      auVar6 = local_140;
      if ((long)sVar4 <= (long)state.p_ - (long)local_140) {
        memcpy((void *)local_140,__src,sVar4);
        auVar6 = (undefined1  [8])((long)local_140 + sVar4);
        if ((long)state.p_ - (long)local_140 != sVar4 &&
            -1 < (long)(((long)state.p_ - (long)local_140) - sVar4)) {
          *(undefined1 *)((long)local_140 + sVar4) = 0x5d;
          local_140 = (undefined1  [8])((long)((long)local_140 + sVar4) + 1);
          bVar3 = Logger::Add((Logger *)local_140,(LogItem *)local_48);
          auVar6 = local_140;
          if (bVar3) {
            bVar3 = Logger::Add((Logger *)local_140,&b);
            auVar6 = local_140;
            if (bVar3) {
              bVar3 = Logger::Add((Logger *)local_140,&c);
              auVar6 = local_140;
              if (bVar3) {
                Logger::Add((Logger *)local_140,&d);
                auVar6 = local_140;
              }
            }
          }
        }
      }
    }
  }
  local_140 = auVar6;
  if (state.p_ <= (ulong)local_140) {
    local_140 = (undefined1  [8])(state.p_ + -1);
  }
  *(undefined1 *)local_140 = 10;
  local_140 = (undefined1  [8])((long)local_140 + 1);
  if (a_local.u_.snum._4_4_ == 0) {
    syscall(1,2,msg);
    return;
  }
  WriteMessage((char *)msg,SUB84(local_140,0) - (int)msg);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void Log(LogMode mode, const char* filename, int line,
         LogItem a, LogItem b, LogItem c, LogItem d) {
  Logger state;
  state.p_ = state.buf_;
  state.end_ = state.buf_ + sizeof(state.buf_);
  state.AddStr(filename, strlen(filename))
      && state.AddStr(":", 1)
      && state.AddNum(line, 10)
      && state.AddStr("]", 1)
      && state.Add(a)
      && state.Add(b)
      && state.Add(c)
      && state.Add(d);

  // Teminate with newline
  if (state.p_ >= state.end_) {
    state.p_ = state.end_ - 1;
  }
  *state.p_ = '\n';
  state.p_++;

  int msglen = state.p_ - state.buf_;
  if (mode == kLog) {
    WriteMessage(state.buf_, msglen);
    return;
  }

  WriteMessage(state.buf_, msglen);

#if defined(__has_builtin)
#if __has_builtin(__builtin_trap)
  __builtin_trap();
#endif
#endif  // defined(__has_builtin)

  abort();
}